

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O3

void __thiscall Js::JSONStringifier::ReadData(JSONStringifier *this,Var value,JSONProperty *prop)

{
  char *addr;
  Type TVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  charcount_t cVar6;
  RecyclableObject *pRVar7;
  undefined4 *puVar8;
  JavascriptString *pJVar9;
  
  bVar4 = VarIs<Js::RecyclableObject>(value);
  if ((bVar4) &&
     (pRVar7 = UnsafeVarTo<Js::RecyclableObject>(value), pRVar7 != (RecyclableObject *)0x0)) {
    ReadData(this,pRVar7,prop);
    return;
  }
  if (value == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00b67ba3;
    *puVar8 = 0;
LAB_00b6795e:
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(value);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00b67ba3;
      *puVar8 = 0;
    }
    TVar1 = ((pRVar7->type).ptr)->typeId;
    if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(pRVar7), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00b67ba3;
      *puVar8 = 0;
    }
    if (TVar1 != TypeIds_Number) {
      if (TVar1 == TypeIds_FirstNumberType) {
LAB_00b67aa3:
        prop->type = Number;
        Memory::Recycler::WBSetBit((char *)&(prop->field_1).obj);
        (prop->field_1).numericValue.value.ptr = value;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&prop->field_1);
        pJVar9 = ScriptContext::GetIntegerString(this->scriptContext,value);
        addr = (char *)((long)&prop->field_1 + 8);
        Memory::Recycler::WBSetBit(addr);
        (prop->field_1).numericValue.string.ptr = pJVar9;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        uVar2 = this->totalStringLength;
        cVar6 = JavascriptString::GetLength((prop->field_1).numericValue.string.ptr);
        if (!CARRY4(cVar6,uVar2)) {
          this->totalStringLength = cVar6 + uVar2;
          return;
        }
        ::Math::DefaultOverflowPolicy();
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONStringifier.cpp"
                                  ,0x328,"((0))","(0)");
      if (bVar4) {
        *puVar8 = 0;
        prop->type = Undefined;
        return;
      }
      goto LAB_00b67ba3;
    }
  }
  else {
    if (((ulong)value & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)value & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00b67ba3;
      *puVar8 = 0;
      goto LAB_00b67aa3;
    }
    if (((ulong)value & 0xffff000000000000) == 0x1000000000000) goto LAB_00b67aa3;
    if ((ulong)value >> 0x32 == 0) goto LAB_00b6795e;
  }
  if ((ulong)value >> 0x32 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                ,0xd4,"(Is(aValue))","Ensure var is actually a \'JavascriptNumber\'"
                               );
    if (!bVar4) {
LAB_00b67ba3:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  SetNumericProperty(this,(double)((ulong)value ^ 0xfffc000000000000),value,prop);
  return;
}

Assistant:

void
JSONStringifier::ReadData(_In_ Var value, _Out_ JSONProperty* prop)
{
    RecyclableObject* valueObj = JavascriptOperators::TryFromVar<RecyclableObject>(value);
    if (valueObj != nullptr)
    {
        ReadData(valueObj, prop);
        return;
    }

    // If value isn't a RecyclableObject, it must be a tagged number

    TypeId typeId = JavascriptOperators::GetTypeId(value);
    switch (typeId)
    {
    case TypeIds_Integer:
    {
        prop->type = JSONContentType::Number;
        prop->numericValue.value = value;
        prop->numericValue.string = this->scriptContext->GetIntegerString(value);
        this->totalStringLength = UInt32Math::Add(this->totalStringLength, prop->numericValue.string->GetLength());
        return;
    }
#if FLOATVAR
    case TypeIds_Number:
        this->SetNumericProperty(JavascriptNumber::GetValue(value), value, prop);
        return;
#endif
    default:
        Assume(UNREACHED);
        prop->type = JSONContentType::Undefined;
        return;
    }
}